

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseData.cpp
# Opt level: O1

void __thiscall
SGParser::Generator::StdGrammarParseData::CreateLexemes
          (StdGrammarParseData *this,
          vector<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_> *lexemes)

{
  pointer pLVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  char **ppcVar5;
  long *local_88 [2];
  long local_78 [2];
  long *local_68 [2];
  long local_58 [2];
  vector<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_> *local_48;
  char *local_40;
  int local_38;
  allocator<char> local_32;
  allocator<char> local_31;
  
  local_48 = lexemes;
  std::vector<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>::resize(lexemes,0x24);
  local_38 = 2;
  ppcVar5 = &CreateLexemes::init[0].RegulaRegExpr;
  lVar4 = 0;
  do {
    pLVar1 = (local_48->super__Vector_base<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pcVar2 = ((LexemeInit *)(ppcVar5 + -1))->Name;
    local_40 = *ppcVar5;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_88,pcVar2,&local_32);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_68,local_40,&local_31);
    iVar3 = local_38;
    if (*pcVar2 == '\0') {
      iVar3 = 0;
    }
    local_40 = pcVar2;
    std::__cxx11::string::_M_assign((string *)((long)&(pLVar1->Name)._M_dataplus._M_p + lVar4));
    std::__cxx11::string::_M_assign
              ((string *)((long)&(pLVar1->RegularExpression)._M_dataplus._M_p + lVar4));
    *(int *)((long)&(pLVar1->Info).TokenCode + lVar4) = iVar3;
    *(undefined4 *)((long)&(pLVar1->Info).Action + lVar4) = 0;
    *(undefined8 *)((long)&(pLVar1->ActionParam)._M_string_length + lVar4) = 0;
    **(undefined1 **)((long)&(pLVar1->ActionParam)._M_dataplus._M_p + lVar4) = 0;
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
    pcVar2 = local_40;
    if (local_88[0] != local_78) {
      operator_delete(local_88[0],local_78[0] + 1);
    }
    local_38 = (local_38 + 1) - (uint)(*pcVar2 == '\0');
    lVar4 = lVar4 + 0x68;
    ppcVar5 = ppcVar5 + 2;
  } while (lVar4 != 0xea0);
  return;
}

Assistant:

void StdGrammarParseData::CreateLexemes(std::vector<Lexeme>& lexemes) {
    // Create the hard-coded internal lexemes structure
    static constexpr size_t LexemeCount = 36u;
    static constexpr struct LexemeInit {
        const char* Name;
        const char* RegulaRegExpr;
    } init[LexemeCount]=
    {
      {"bad_char",         "[^ \r\n\t]"              },
      {"",                 "[ \t\r\n]+"              }, // whitespace
      {"number_int",       "[0-9]+"                  },
      {"string_cons",      "\"[^\"]*\""              },
      {"identifier",       "[A-Za-z_][A-Za-z0-9_]*"  },
      {"",                 "\\/\\/.*"                }, // single line comment
      {"macro",            "%macro"                  },

      {"expression",       "%expression"             },
      {"ignore",           "%ignore"                 },
      {"push",             "%push"                   },
      {"pop",              "%pop"                    },
      {"goto",             "%goto"                   },

      {"prec",             "%prec"                   },
      {"left",             "%left"                   },
      {"right",            "%right"                  },
      {"nonassoc",         "%nonassoc"               },

      {"production",       "%production"             },
      {"shifton",          "%shifton"                },
      {"reduceon",         "%reduceon"               },
      {"reduce",           "%reduce"                 },
      {"action",           "%action"                 },
      {"error",            "%error",                 },
      {"error_backtrack",  "%error_backtrack",       },

      {",",                ","                       },
      {";",                ";"                       },
      {"?",                "\\?"                     },
      {"&",                "\\&"                     },
      {"|",                "\\|"                     },
      {"{",                "\\{"                     },
      {"}",                "\\}"                     },
      {"(",                "\\("                     },
      {")",                "\\)"                     },
      {">",                ">"                       },
      {"->",               "\\-\\>"                  },
      {"quote_cons",       "\'((\'\')|[^\'\n\r])*\'" },

      // Expression from the web (old one did not seem to work):
      // /\*[^*]*\*+([^/*][^*]*\*+)*/
      {"",                 "\\/\\*[^\\*]*\\*+([^\\/\\*][^\\*]*\\*+)*\\/" }  // Multi-line comment
      // Improvements:
      // Ideally we have lazy loops (x*?): "/\\*.*?\\*/"
      // Second best, if we have possessive qualifiers (x*+):
      // "/\\*[^*]*+\\*++([^/][^*]*+\\*++)*+/"
      // Worst case, we can at least remove unnecessary backslashes:
      // "/\\*[^*]*\\*+([^/\\*][^*]*\\*+)*/"
    };

    unsigned idCount = TokenCode::TokenFirstID;
    lexemes.resize(LexemeCount);
    for (size_t i = 0u; i < LexemeCount; ++i) {
        lexemes[i].SetLexeme(init[i].Name, init[i].RegulaRegExpr, init[i].Name[0u] ? idCount : 0u);
        if (init[i].Name[0u])
            ++idCount;
    }
}